

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pnext_chain_pdf2(Impl *this,Value *pnext,void **outpNext)

{
  VkStructureType VVar1;
  VkPhysicalDeviceMeshShaderFeaturesEXT *pVVar2;
  bool bVar3;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar4;
  Type pGVar5;
  VkPhysicalDeviceMeshShaderFeaturesEXT *pVVar6;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  VkPhysicalDeviceMeshShaderFeaturesEXT *pVVar7;
  VkPhysicalDeviceMeshShaderFeaturesEXT *pVVar8;
  long *in_FS_OFFSET;
  VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *fragment_shading_rate_enums;
  VkPhysicalDeviceMeshShaderFeaturesEXT *local_48;
  Impl *local_40;
  void **local_38;
  
  local_40 = this;
  if ((pnext->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x68c,
                  "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)((ulong)(pnext->data_).s.str & 0xffffffffffff);
  local_38 = outpNext;
  pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::End(pnext);
  if (pGVar4 == this_00) {
    pVVar6 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
  }
  else {
    pVVar7 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
    pVVar8 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
    do {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"sType");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) {
        __assert_fail("data_.f.flags & kIntFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                      ,0x718,
                      "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      VVar1 = (pGVar5->data_).s.length;
      if ((int)VVar1 < 0x3b9fcb40) {
        if ((int)VVar1 < 0x3b9f2730) {
          if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV) {
            local_48 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
            parse_mesh_shader_features_nv
                      (local_40,(Value *)this_00,(VkPhysicalDeviceMeshShaderFeaturesNV **)&local_48)
            ;
          }
          else {
            if (VVar1 != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR) {
LAB_001462c0:
              if (2 < *(int *)(*in_FS_OFFSET + -0x18)) {
                return false;
              }
              bVar3 = Internal::log_thread_callback
                                (LOG_ERROR,"Failed to parse pNext chain for sType: %d\n",
                                 (ulong)VVar1);
              if (bVar3) {
                return false;
              }
              fprintf(_stderr,"Fossilize ERROR: Failed to parse pNext chain for sType: %d\n",
                      (ulong)VVar1);
              return false;
            }
            local_48 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
            parse_fragment_shading_rate_features
                      (local_40,(Value *)this_00,
                       (VkPhysicalDeviceFragmentShadingRateFeaturesKHR **)&local_48);
          }
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT) {
          local_48 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
          parse_robustness2_features
                    (local_40,(Value *)this_00,(VkPhysicalDeviceRobustness2FeaturesEXT **)&local_48)
          ;
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT) {
          local_48 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
          parse_descriptor_buffer_features
                    (local_40,(Value *)this_00,
                     (VkPhysicalDeviceDescriptorBufferFeaturesEXT **)&local_48);
        }
        else {
          if (VVar1 != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV)
          goto LAB_001462c0;
          local_48 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
          parse_fragment_shading_rate_enums_features
                    (local_40,(Value *)this_00,
                     (VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV **)&local_48);
        }
      }
      else if ((int)VVar1 < 0x3ba09e30) {
        if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT) {
          local_48 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
          parse_mesh_shader_features(local_40,(Value *)this_00,&local_48);
        }
        else {
          if (VVar1 != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES)
          goto LAB_001462c0;
          local_48 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
          parse_image_robustness_features
                    (local_40,(Value *)this_00,
                     (VkPhysicalDeviceImageRobustnessFeaturesEXT **)&local_48);
        }
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT) {
        local_48 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
        parse_primitives_generated_query_features
                  (local_40,(Value *)this_00,
                   (VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT **)&local_48);
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT) {
        local_48 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
        parse_2d_view_of_3d_features
                  (local_40,(Value *)this_00,
                   (VkPhysicalDeviceImage2DViewOf3DFeaturesEXT **)&local_48);
      }
      else {
        if (VVar1 != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT)
        goto LAB_001462c0;
        local_48 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
        parse_shader_object_features
                  (local_40,(Value *)this_00,(VkPhysicalDeviceShaderObjectFeaturesEXT **)&local_48);
      }
      pVVar2 = local_48;
      local_48->sType = VVar1;
      local_48->pNext = (void *)0x0;
      pVVar6 = local_48;
      if (pVVar8 != (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0) {
        pVVar8->pNext = local_48;
        pVVar6 = pVVar7;
      }
      this_00 = this_00 + 0x10;
      pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::End(pnext);
      pVVar7 = pVVar6;
      pVVar8 = pVVar2;
    } while (this_00 != pGVar4);
  }
  *local_38 = pVVar6;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_pnext_chain_pdf2(const Value &pnext, void **outpNext)
{
	VkBaseInStructure *ret = nullptr;
	VkBaseInStructure *chain = nullptr;

	for (auto itr = pnext.Begin(); itr != pnext.End(); ++itr)
	{
		auto &next = *itr;
		auto sType = static_cast<VkStructureType>(next["sType"].GetInt());
		VkBaseInStructure *new_struct = nullptr;

		switch (sType)
		{
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT:
		{
			VkPhysicalDeviceRobustness2FeaturesEXT *robustness2 = nullptr;
			if (!parse_robustness2_features(next, &robustness2))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(robustness2);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT:
		{
			VkPhysicalDeviceImageRobustnessFeaturesEXT *image_robustness = nullptr;
			if (!parse_image_robustness_features(next, &image_robustness))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(image_robustness);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV:
		{
			VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *fragment_shading_rate_enums = nullptr;
			if (!parse_fragment_shading_rate_enums_features(next, &fragment_shading_rate_enums))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(fragment_shading_rate_enums);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR:
		{
			VkPhysicalDeviceFragmentShadingRateFeaturesKHR *fragment_shading_rate = nullptr;
			if (!parse_fragment_shading_rate_features(next, &fragment_shading_rate))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(fragment_shading_rate);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT:
		{
			VkPhysicalDeviceMeshShaderFeaturesEXT *mesh_shader = nullptr;
			if (!parse_mesh_shader_features(next, &mesh_shader))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(mesh_shader);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV:
		{
			VkPhysicalDeviceMeshShaderFeaturesNV *mesh_shader = nullptr;
			if (!parse_mesh_shader_features_nv(next, &mesh_shader))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(mesh_shader);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT:
		{
			VkPhysicalDeviceDescriptorBufferFeaturesEXT *descriptor_buffer = nullptr;
			if (!parse_descriptor_buffer_features(next, &descriptor_buffer))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(descriptor_buffer);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT:
		{
			VkPhysicalDeviceShaderObjectFeaturesEXT *shader_object = nullptr;
			if (!parse_shader_object_features(next, &shader_object))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(shader_object);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT:
		{
			VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *prim_generated = nullptr;
			if (!parse_primitives_generated_query_features(next, &prim_generated))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(prim_generated);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT:
		{
			VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *view_2d_of_3d = nullptr;
			if (!parse_2d_view_of_3d_features(next, &view_2d_of_3d))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(view_2d_of_3d);
			break;
		}

		default:
			LOGE_LEVEL("Failed to parse pNext chain for sType: %d\n", int(sType));
			return false;
		}

		new_struct->sType = sType;
		new_struct->pNext = nullptr;

		if (!chain)
		{
			chain = new_struct;
			ret = chain;
		}
		else
		{
			chain->pNext = new_struct;
			chain = new_struct;
		}
	}

	*outpNext = ret;
	return true;
}